

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

void Mop_ManPrintOne(Mop_Man_t *p,int iCube)

{
  int iVar1;
  uint uVar2;
  word *p_00;
  word *p_01;
  word *pCubeOut;
  word *pCubeIn;
  int local_18;
  char Symb [4];
  int k;
  int iCube_local;
  Mop_Man_t *p_local;
  
  pCubeIn._4_4_ = 0x3f31302d;
  Symb = (char  [4])iCube;
  p_00 = Mop_ManCubeIn(p,iCube);
  p_01 = Mop_ManCubeOut(p,(int)Symb);
  for (local_18 = 0; local_18 < p->nIns; local_18 = local_18 + 1) {
    iVar1 = Abc_TtGetQua(p_00,local_18);
    printf("%c",(ulong)(uint)(int)*(char *)((long)&pCubeIn + (long)iVar1 + 4));
  }
  printf(" ");
  for (local_18 = 0; local_18 < p->nOuts; local_18 = local_18 + 1) {
    uVar2 = Abc_TtGetBit(p_01,local_18);
    printf("%d",(ulong)uVar2);
  }
  printf("\n");
  return;
}

Assistant:

void Mop_ManPrintOne( Mop_Man_t * p, int iCube )
{
    int k;
    char Symb[4] = { '-', '0', '1', '?' };
    word * pCubeIn  = Mop_ManCubeIn( p, iCube );
    word * pCubeOut = Mop_ManCubeOut( p, iCube );
    for ( k = 0; k < p->nIns; k++ )
        printf( "%c", Symb[Abc_TtGetQua(pCubeIn, k)] );
    printf( " " );
    for ( k = 0; k < p->nOuts; k++ )
        printf( "%d", Abc_TtGetBit(pCubeOut, k) );
    printf( "\n" );
}